

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int fits_ushort_to_int_inplace(unsigned_short *ushortarray,long length,int shift,int *status)

{
  bool bVar1;
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  void *__src;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (*status < 1) {
    lVar4 = 10000;
    if (length < 10000) {
      lVar4 = length;
    }
    __src = malloc(lVar4 * 4);
    if (__src != (void *)0x0) {
      if (0 < length) {
        lVar5 = length - lVar4;
        do {
          lVar2 = 1;
          if (1 < lVar4) {
            lVar2 = lVar4;
          }
          lVar3 = 0;
          do {
            *(uint *)((long)__src + lVar3 * 4) = (uint)ushortarray[lVar5 + lVar3] + shift;
            lVar3 = lVar3 + 1;
          } while (lVar2 != lVar3);
          memcpy(ushortarray + lVar5 * 2,__src,lVar4 * 4);
          if (lVar5 < 0x2711) {
            lVar4 = lVar5;
          }
          bVar1 = lVar5 < 0x2711;
          lVar5 = lVar5 + -10000;
          if (bVar1) {
            lVar5 = 0;
          }
        } while (0 < lVar4);
      }
      free(__src);
      return extraout_EAX;
    }
    ffpmsg("Out of memory. (fits_ushort_to_int_inplace)");
    *status = 0x71;
    in_EAX = extraout_EAX_00;
  }
  return in_EAX;
}

Assistant:

static int fits_ushort_to_int_inplace(unsigned short *ushortarray, long length, 
                                      int shift, int *status)

/* convert the input array of 16-bit unsigned integers into an array of 32-bit integers,
in place. This will overwrite the input array with the new longer array starting
at the same memory location.  

Note that aliasing the same memory location with pointers of different datatypes is
not allowed in strict ANSI C99, however it is  used here for efficency. In principle,
one could simply copy the input array in reverse order to the output array,
but this only works if the compiler performs the operation in strict order.  Certain
compiler optimization techniques may vioate this assumption.  Therefore, we first
copy a section of the input array to a temporary intermediate array, before copying
the longer datatype values back to the original array.
*/

{
    int *intarray, *aliasarray;
    long ii, ntodo, firstelem, nmax = 10000;
    
    if (*status > 0) 
        return(*status);

    ntodo = nmax;
    if (length < nmax) ntodo = length;
    
    firstelem = length - ntodo;  /* first element to be converted */
    
    intarray = (int *) malloc(ntodo * sizeof(int));
    
    if (intarray == NULL)
    {
	ffpmsg("Out of memory. (fits_ushort_to_int_inplace)");
	return (*status = MEMORY_ALLOCATION);
    }

    aliasarray = (int *) ushortarray; /* alias pointer to the input array */

    while (ntodo > 0) {
    
	/* do datatype conversion into temp array */
        for (ii = 0; ii < ntodo; ii++) { 
	    intarray[ii] = (int)(ushortarray[ii + firstelem]) + shift;
        }

        /* copy temp array back to alias */
        memcpy(&(aliasarray[firstelem]), intarray, ntodo * 4);
	
        if (firstelem == 0) {  /* we are all done */
	    ntodo = 0;   
	} else {  /* recalculate ntodo and firstelem for next loop */
	    if (firstelem > nmax) {
	        firstelem -= nmax;
	    } else {
	        ntodo = firstelem;
	        firstelem = 0;
	    }
	}
    }

    free(intarray);
    return(*status);
}